

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall Clasp::Solver::Dirty::add(Dirty *this,Literal p,WatchList *wl,Constraint *c)

{
  uintp *puVar1;
  bool bVar2;
  uint uVar3;
  uintp other;
  uint uVar4;
  left_type local_14;
  
  uVar3 = *(uint *)&(wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                    field_0x8 & 0x7fffffff;
  uVar4 = uVar3 - (wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                  right_;
  if (0x4f < uVar4) {
    puVar1 = (uintp *)(wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>
                      .buf_;
    if ((wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ < 8) {
      other = 0;
    }
    else {
      other = *puVar1;
    }
    bVar2 = add<Clasp::Constraint>
                      (this,(Constraint **)((long)puVar1 + ((ulong)uVar3 - 0x10)),other,c);
    if (bVar2) {
      bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::push_left
                ((left_right_rep<Clasp::Literal,_unsigned_int> *)this,&local_14);
    }
  }
  return 0x4f < uVar4;
}

Assistant:

bool add(Literal p, WatchList& wl, Constraint* c) {
		if (wl.right_size() <= min_size) { return false; }
		uintp o = wl.left_size() > 0 ? reinterpret_cast<uintp>(wl.left_begin()->head) : 0;
		if (add(wl.right_begin()->con, o, c)) { dirty.push_left(p); }
		return true;
	}